

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int ixmlNode_setNodeValue(IXML_Node *nodeptr,char *newNodeValue)

{
  char *pcVar1;
  int rc;
  char *newNodeValue_local;
  IXML_Node *nodeptr_local;
  
  if (nodeptr == (IXML_Node *)0x0) {
    nodeptr_local._4_4_ = 0x69;
  }
  else {
    if (nodeptr->nodeValue != (char *)0x0) {
      free(nodeptr->nodeValue);
      nodeptr->nodeValue = (char *)0x0;
    }
    if (newNodeValue != (char *)0x0) {
      pcVar1 = strdup(newNodeValue);
      nodeptr->nodeValue = pcVar1;
      if (nodeptr->nodeValue == (char *)0x0) {
        return 0x66;
      }
    }
    nodeptr_local._4_4_ = 0;
  }
  return nodeptr_local._4_4_;
}

Assistant:

int ixmlNode_setNodeValue(IXML_Node *nodeptr, const char *newNodeValue)
{
	int rc = IXML_SUCCESS;

	if (nodeptr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (nodeptr->nodeValue != NULL) {
		free(nodeptr->nodeValue);
		nodeptr->nodeValue = NULL;
	}

	if (newNodeValue != NULL) {
		nodeptr->nodeValue = strdup(newNodeValue);
		if (nodeptr->nodeValue == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
	}

	return rc;
}